

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_c_string_literal.c
# Opt level: O3

void BinarySink_put_c_string_literal(BinarySink *bs,ptrlen str)

{
  uchar val;
  uchar *puVar1;
  char *p;
  char *pcVar2;
  BinarySink *bs_00;
  uchar *puVar3;
  ptrlen pl;
  
  puVar3 = (uchar *)str.ptr;
  if (0 < (long)str.len) {
    puVar1 = puVar3 + str.len;
    do {
      val = *puVar3;
      switch(val) {
      case '\b':
        bs_00 = bs->binarysink_;
        pcVar2 = "\\b";
        break;
      case '\t':
        bs_00 = bs->binarysink_;
        pcVar2 = "\\t";
        break;
      case '\n':
        bs_00 = bs->binarysink_;
        pcVar2 = "\\n";
        break;
      case '\v':
      case '\f':
switchD_00136fc4_caseD_b:
        if ((byte)(val - 0x20) < 0x5f) {
          BinarySink_put_byte(bs->binarysink_,val);
        }
        else {
          BinarySink_put_fmt(bs->binarysink_,"\\%03o");
        }
        goto LAB_0013704b;
      case '\r':
        bs_00 = bs->binarysink_;
        pcVar2 = "\\r";
        break;
      default:
        if (val == '\"') {
          bs_00 = bs->binarysink_;
          pcVar2 = "\\\"";
        }
        else {
          if (val != '\\') goto switchD_00136fc4_caseD_b;
          bs_00 = bs->binarysink_;
          pcVar2 = "\\\\";
        }
      }
      pl.len = 2;
      pl.ptr = pcVar2;
      BinarySink_put_datapl(bs_00,pl);
LAB_0013704b:
      puVar3 = puVar3 + 1;
    } while (puVar3 < puVar1);
  }
  return;
}

Assistant:

void BinarySink_put_c_string_literal(BinarySink *bs, ptrlen str)
{
    for (const char *p = str.ptr; p < (const char *)str.ptr + str.len; p++) {
        char c = *p;

        if (c == '\n')
            put_datalit(bs, "\\n");
        else if (c == '\r')
            put_datalit(bs, "\\r");
        else if (c == '\t')
            put_datalit(bs, "\\t");
        else if (c == '\b')
            put_datalit(bs, "\\b");
        else if (c == '\\')
            put_datalit(bs, "\\\\");
        else if (c == '"')
            put_datalit(bs, "\\\"");
        else if (c >= 32 && c <= 126)
            put_byte(bs, c);
        else
            put_fmt(bs, "\\%03o", (unsigned)c & 0xFFU);
    }
}